

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_png_file(char *filename,int width,int height,uchar *pixels,Color *palette)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  allocator local_289;
  string local_288 [36];
  uint local_264;
  int local_260;
  uint error;
  int i;
  undefined1 local_250 [8];
  State state;
  vector<unsigned_char,_std::allocator<unsigned_char>_> png;
  Color *palette_local;
  uchar *pixels_local;
  int height_local;
  int width_local;
  char *filename_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &state.super_LodePNGState.error);
  lodepng::State::State((State *)local_250);
  state.super_LodePNGState.encoder.text_compression = 3;
  state.super_LodePNGState.encoder._84_4_ = 8;
  for (local_260 = 0; local_260 < 0x10; local_260 = local_260 + 1) {
    lVar3 = (long)local_260;
    lodepng_palette_add((LodePNGColorMode *)&state.super_LodePNGState.encoder.text_compression,
                        palette[lVar3].red,palette[lVar3].green,palette[lVar3].blue,0xff);
  }
  local_264 = lodepng::encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &state.super_LodePNGState.error,pixels,width,height,(State *)local_250
                             );
  if (local_264 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,filename,&local_289);
    lodepng::save_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &state.super_LodePNGState.error,(string *)local_288);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
  }
  if (local_264 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[write_png_file] encoder error ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_264);
    poVar1 = std::operator<<(poVar1,": ");
    pcVar2 = lodepng_error_text(local_264);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  lodepng::State::~State((State *)local_250);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &state.super_LodePNGState.error);
  return;
}

Assistant:

void write_png_file(const char *filename, int width, int height, const unsigned char *pixels, Color *palette) {
    std::vector<unsigned char> png;
    lodepng::State state;
    state.info_raw.colortype = LCT_PALETTE;
    state.info_raw.bitdepth = 8;

    for (int i = 0; i < MAX_COLOURS; i++) {
        lodepng_palette_add(
                &state.info_raw,
                palette[i].red,
                palette[i].green,
                palette[i].blue,
                0xFF
        );
    }
    unsigned error = lodepng::encode(png, pixels, (unsigned )width, (unsigned )height, state);
    if(!error) lodepng::save_file(png, filename);
    if (error) {
        std::cout << "[write_png_file] encoder error " << error << ": "<< lodepng_error_text(error) << std::endl;
    }
}